

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# num_parse_test.cpp
# Opt level: O0

void __thiscall
num_parse_test_parse_signed_limits_Test::TestBody(num_parse_test_parse_signed_limits_Test *this)

{
  int *piVar1;
  bool bVar2;
  char *pcVar3;
  AssertHelper local_70;
  Message local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  int32_t min32;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  int res32;
  int32_t max32;
  num_parse_test_parse_signed_limits_Test *this_local;
  
  gtest_ar.message_.ptr_._4_4_ = std::numeric_limits<int>::max();
  piVar1 = (int *)((long)&gtest_ar.message_.ptr_ + 4);
  gtest_ar.message_.ptr_._0_4_ =
       mvm::num::parse<int,4ul,mvm::num::little_endian_tag>((uint8_t *)piVar1);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_28,"res32","max32",(int *)&gtest_ar.message_,piVar1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar2) {
    testing::Message::Message(local_40);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kenavolic[P]mvm/tests/num_parse_test.cpp"
               ,0x4b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffffb8,local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb8);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  gtest_ar_1.message_.ptr_._4_4_ = std::numeric_limits<int>::min();
  piVar1 = (int *)((long)&gtest_ar_1.message_.ptr_ + 4);
  gtest_ar.message_.ptr_._0_4_ =
       mvm::num::parse<int,4ul,mvm::num::little_endian_tag>((uint8_t *)piVar1);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_60,"res32","min32",(int *)&gtest_ar.message_,piVar1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar2) {
    testing::Message::Message(&local_68);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kenavolic[P]mvm/tests/num_parse_test.cpp"
               ,0x50,pcVar3);
    testing::internal::AssertHelper::operator=(&local_70,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  return;
}

Assistant:

TEST(num_parse_test, parse_signed_limits) {
  int32_t max32 = std::numeric_limits<int32_t>::max();
  auto res32 = parse<int32_t, sizeof(int32_t), default_endian_type>(
      reinterpret_cast<uint8_t const *>(&max32));
  EXPECT_EQ(res32, max32);

  int32_t min32 = std::numeric_limits<int32_t>::min();
  res32 = parse<int32_t, sizeof(int32_t), default_endian_type>(
      reinterpret_cast<uint8_t const *>(&min32));
  EXPECT_EQ(res32, min32);
}